

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O0

void __thiscall
flatbuffers::BinaryAnnotator::BuildString
          (BinaryAnnotator *this,uint64_t string_offset,Object *table,Field *field)

{
  uint64_t length;
  bool bVar1;
  uint *puVar2;
  ulong uVar3;
  String *pSVar4;
  char *pcVar5;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_860;
  allocator<char> local_841;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  BinarySection local_7e0;
  BinaryRegionComment local_7a0;
  BinaryRegion local_728;
  undefined1 local_688 [8];
  BinaryRegionComment string_terminator_comment;
  BinaryRegion local_598;
  undefined1 local_4f8 [8];
  BinaryRegionComment string_comment;
  BinaryRegion local_408;
  BinaryRegionComment local_368;
  BinaryRegion local_2f0;
  allocator<char> local_249;
  string local_248;
  long local_228;
  uint64_t string_end;
  undefined1 local_218 [4];
  uint32_t string_size;
  BinaryRegion local_1a0;
  allocator<char> local_f9;
  string local_f8;
  uint64_t local_d8;
  uint64_t remaining;
  BinaryRegionComment string_length_comment;
  _Optional_payload_base<unsigned_int> local_48;
  Optional<unsigned_int> string_length;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  Field *field_local;
  Object *table_local;
  uint64_t string_offset_local;
  BinaryAnnotator *this_local;
  
  bVar1 = ContainsSection(this,string_offset);
  if (!bVar1) {
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::vector
              ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
               &string_length);
    local_48 = (_Optional_payload_base<unsigned_int>)ReadScalar<unsigned_int>(this,string_offset);
    BinaryRegionComment::BinaryRegionComment((BinaryRegionComment *)&remaining);
    string_length_comment.status_message.field_2._8_4_ = 0xf;
    bVar1 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)&local_48);
    if (bVar1) {
      puVar2 = std::optional<unsigned_int>::value((optional<unsigned_int> *)&local_48);
      string_end._4_4_ = *puVar2;
      local_228 = string_offset + 5 + (ulong)string_end._4_4_;
      bVar1 = IsValidOffset(this,local_228 - 1);
      if (bVar1) {
        BinaryRegionComment::BinaryRegionComment
                  ((BinaryRegionComment *)&string_comment.index,(BinaryRegionComment *)&remaining);
        anon_unknown_46::MakeBinaryRegion
                  (&local_408,string_offset,4,Uint32,0,0,
                   (BinaryRegionComment *)&string_comment.index);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
        push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                  &string_length,&local_408);
        BinaryRegion::~BinaryRegion(&local_408);
        BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&string_comment.index);
        BinaryRegionComment::BinaryRegionComment((BinaryRegionComment *)local_4f8);
        string_comment.status_message.field_2._8_4_ = 0x10;
        uVar3 = (ulong)string_end._4_4_;
        BinaryRegionComment::BinaryRegionComment
                  ((BinaryRegionComment *)&string_terminator_comment.index,
                   (BinaryRegionComment *)local_4f8);
        anon_unknown_46::MakeBinaryRegion
                  (&local_598,string_offset + 4,uVar3,Char,uVar3,0,
                   (BinaryRegionComment *)&string_terminator_comment.index);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
        push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                  &string_length,&local_598);
        BinaryRegion::~BinaryRegion(&local_598);
        BinaryRegionComment::~BinaryRegionComment
                  ((BinaryRegionComment *)&string_terminator_comment.index);
        BinaryRegionComment::BinaryRegionComment((BinaryRegionComment *)local_688);
        string_terminator_comment.status_message.field_2._8_4_ = 0x11;
        uVar3 = (ulong)string_end._4_4_;
        BinaryRegionComment::BinaryRegionComment(&local_7a0,(BinaryRegionComment *)local_688);
        anon_unknown_46::MakeBinaryRegion
                  (&local_728,string_offset + 4 + uVar3,1,Char,0,0,&local_7a0);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
        push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                  &string_length,&local_728);
        BinaryRegion::~BinaryRegion(&local_728);
        BinaryRegionComment::~BinaryRegionComment(&local_7a0);
        BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_688);
        BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_4f8);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"",&local_249);
        anon_unknown_46::SetError
                  ((BinaryRegionComment *)&remaining,ERROR_LENGTH_TOO_LONG,&local_248);
        std::__cxx11::string::~string((string *)&local_248);
        std::allocator<char>::~allocator(&local_249);
        BinaryRegionComment::BinaryRegionComment(&local_368,(BinaryRegionComment *)&remaining);
        anon_unknown_46::MakeBinaryRegion(&local_2f0,string_offset,4,Uint32,0,0,&local_368);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
        push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                  &string_length,&local_2f0);
        BinaryRegion::~BinaryRegion(&local_2f0);
        BinaryRegionComment::~BinaryRegionComment(&local_368);
      }
    }
    else {
      local_d8 = RemainingBytes(this,string_offset);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"4",&local_f9);
      anon_unknown_46::SetError((BinaryRegionComment *)&remaining,ERROR_INCOMPLETE_BINARY,&local_f8)
      ;
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator(&local_f9);
      length = local_d8;
      BinaryRegionComment::BinaryRegionComment
                ((BinaryRegionComment *)local_218,(BinaryRegionComment *)&remaining);
      anon_unknown_46::MakeBinaryRegion
                (&local_1a0,string_offset,length,Unknown,length,0,(BinaryRegionComment *)local_218);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::push_back
                ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                 &string_length,&local_1a0);
      BinaryRegion::~BinaryRegion(&local_1a0);
      BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_218);
    }
    pSVar4 = reflection::Object::name(table);
    pcVar5 = String::c_str(pSVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_840,pcVar5,&local_841);
    std::operator+(&local_820,&local_840,".");
    pSVar4 = reflection::Field::name(field);
    pcVar5 = String::c_str(pSVar4);
    std::operator+(&local_800,&local_820,pcVar5);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::vector
              (&local_860,
               (vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
               &string_length);
    anon_unknown_46::MakeBinarySection(&local_7e0,&local_800,String,&local_860);
    AddSection(this,string_offset,&local_7e0);
    BinarySection::~BinarySection(&local_7e0);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              (&local_860);
    std::__cxx11::string::~string((string *)&local_800);
    std::__cxx11::string::~string((string *)&local_820);
    std::__cxx11::string::~string((string *)&local_840);
    std::allocator<char>::~allocator(&local_841);
    BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&remaining);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
               &string_length);
  }
  return;
}

Assistant:

void BinaryAnnotator::BuildString(const uint64_t string_offset,
                                  const reflection::Object *const table,
                                  const reflection::Field *const field) {
  // Check if we have already generated this string section, and this is a
  // shared string instance.
  if (ContainsSection(string_offset)) { return; }

  std::vector<BinaryRegion> regions;
  const auto string_length = ReadScalar<uint32_t>(string_offset);

  BinaryRegionComment string_length_comment;
  string_length_comment.type = BinaryRegionCommentType::StringLength;

  if (!string_length.has_value()) {
    const uint64_t remaining = RemainingBytes(string_offset);

    SetError(string_length_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
             "4");

    regions.push_back(MakeBinaryRegion(string_offset, remaining,
                                       BinaryRegionType::Unknown, remaining, 0,
                                       string_length_comment));

  } else {
    const uint32_t string_size = string_length.value();
    const uint64_t string_end =
        string_offset + sizeof(uint32_t) + string_size + sizeof(char);

    if (!IsValidOffset(string_end - 1)) {
      SetError(string_length_comment,
               BinaryRegionStatus::ERROR_LENGTH_TOO_LONG);

      regions.push_back(MakeBinaryRegion(string_offset, sizeof(uint32_t),
                                         BinaryRegionType::Uint32, 0, 0,
                                         string_length_comment));
    } else {
      regions.push_back(MakeBinaryRegion(string_offset, sizeof(uint32_t),
                                         BinaryRegionType::Uint32, 0, 0,
                                         string_length_comment));

      BinaryRegionComment string_comment;
      string_comment.type = BinaryRegionCommentType::StringValue;

      regions.push_back(MakeBinaryRegion(string_offset + sizeof(uint32_t),
                                         string_size, BinaryRegionType::Char,
                                         string_size, 0, string_comment));

      BinaryRegionComment string_terminator_comment;
      string_terminator_comment.type =
          BinaryRegionCommentType::StringTerminator;

      regions.push_back(MakeBinaryRegion(
          string_offset + sizeof(uint32_t) + string_size, sizeof(char),
          BinaryRegionType::Char, 0, 0, string_terminator_comment));
    }
  }

  AddSection(string_offset,
             MakeBinarySection(std::string(table->name()->c_str()) + "." +
                                   field->name()->c_str(),
                               BinarySectionType::String, std::move(regions)));
}